

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

char * __thiscall TadsXml::strip_xml_header(TadsXml *this,char *buf)

{
  char cVar1;
  int iVar2;
  char *in_RSI;
  bool bVar3;
  int qu;
  char *p;
  size_t in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  char *local_20;
  
  local_20 = in_RSI;
  while( true ) {
    iVar2 = isspace((int)*local_20);
    bVar3 = true;
    if ((iVar2 == 0) && (bVar3 = true, *local_20 != '\n')) {
      bVar3 = *local_20 == '\r';
    }
    if (!bVar3) break;
    local_20 = local_20 + 1;
  }
  iVar2 = memicmp(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  if (iVar2 == 0) {
    cVar1 = '\0';
    for (local_20 = local_20 + 6; *local_20 != '\0'; local_20 = local_20 + 1) {
      if ((*local_20 == '\"') || (*local_20 == '\'')) {
        if (cVar1 == '\0') {
          cVar1 = *local_20;
        }
        else if (*local_20 == cVar1) {
          cVar1 = '\0';
        }
      }
      else if ((*local_20 == '?') && (local_20[1] == '>')) {
        local_20 = local_20 + 2;
        while( true ) {
          bVar3 = true;
          if (*local_20 != '\n') {
            bVar3 = *local_20 == '\r';
          }
          if (!bVar3) break;
          local_20 = local_20 + 1;
        }
        return local_20;
      }
    }
  }
  return in_RSI;
}

Assistant:

const char *TadsXml::strip_xml_header(const char *buf)
{
    const char *p;

    /* skip any initial newlines or whitespace */
    for (p = buf ; isspace(*p) || *p == '\n' || *p == '\r' ; ++p) ;

    /* if it starts with "<?xml", find the end of the directive */
    if (memicmp(p, "<?xml ", 6) == 0)
    {
        int qu;

        /* scan for the matching '>' */
        for (p += 6, qu = 0 ; *p != '\0' ; ++p)
        {
            /* check for quotes */
            if (*p == '"' || *p == '\'')
            {
                /* 
                 *   if we're in a quoted section, and this is the matching
                 *   close quote, leave the quoted section; if we're not in a
                 *   quoted section, this is the opening quote of a quoted
                 *   section 
                 */
                if (qu == 0)
                {
                    /* we weren't in a quoted section, so now we are */
                    qu = *p;
                }
                else if (*p == qu)
                {
                    /* we were in a quoted section, and it's our close quote */
                    qu = 0;
                }
            }
            else if (*p == '?' && *(p+1) == '>')
            {
                /* 
                 *   It's the end of the directive.  Skip the "?>" sequence
                 *   and any subsequent newline characters.  
                 */
                for (p += 2 ; *p == '\n' || *p == '\r' ; ++p) ;

                /* 
                 *   we're now at the start of the XML contents - return the
                 *   current pointer 
                 */
                return p;
            }
        }
    }

    /* 
     *   we either didn't find the start of the <?XML?> directive, or we
     *   couldn't find the end of it - in either case, we don't have a
     *   well-formed directive, so there's nothing to strip: just return the
     *   original buffer 
     */
    return buf;
}